

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_field_inverse_var(void *arg,int iters)

{
  secp256k1_fe *r;
  int iVar1;
  bool bVar2;
  
  r = (secp256k1_fe *)((long)arg + 0x40);
  iVar1 = 0;
  if (0 < iters) {
    iVar1 = iters;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_impl_inv_var(r,r);
    secp256k1_fe_impl_add(r,(secp256k1_fe *)((long)arg + 0x68));
  }
  return;
}

Assistant:

static void bench_field_inverse_var(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_fe_inv_var(&data->fe[0], &data->fe[0]);
        secp256k1_fe_add(&data->fe[0], &data->fe[1]);
    }
}